

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O0

bool __thiscall
iDynTree::SixAxisForceTorqueSensor::getLinkSensorTransform
          (SixAxisForceTorqueSensor *this,LinkIndex link_index,Transform *link_H_sensor)

{
  Transform *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x20) == in_RSI) {
    iDynTree::Transform::operator=(in_RDX,(Transform *)(*(long *)(in_RDI + 8) + 0x38));
    local_1 = true;
  }
  else if (*(long *)(*(long *)(in_RDI + 8) + 0x28) == in_RSI) {
    iDynTree::Transform::operator=(in_RDX,(Transform *)(*(long *)(in_RDI + 8) + 0x98));
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SixAxisForceTorqueSensor::getLinkSensorTransform(const LinkIndex link_index, iDynTree::Transform& link_H_sensor) const
{
    if( this->pimpl->link1 == link_index )
    {
        link_H_sensor = this->pimpl->link1_H_sensor;
        return true;
    }

    if( this->pimpl->link2 == link_index )
    {
        link_H_sensor = this->pimpl->link2_H_sensor;
        return true;
    }

    return false;
}